

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_mutex.hpp
# Opt level: O1

bool __thiscall
yamc::fair::detail::timed_mutex_impl::
impl_try_lockwait<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (timed_mutex_impl *this,unique_lock<std::mutex> *lk,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp)

{
  node *pnVar1;
  node *pnVar2;
  node *pnVar3;
  cv_status cVar4;
  node request;
  node local_38;
  
  if ((timed_mutex_impl *)(this->queue_).next == this) {
    pnVar2 = (this->queue_).prev;
    (this->queue_).prev = &this->locked_;
    pnVar2->next = &this->locked_;
    (this->locked_).next = &this->queue_;
    (this->locked_).prev = pnVar2;
  }
  else {
    local_38.prev = (this->queue_).prev;
    (this->queue_).prev = &local_38;
    (local_38.prev)->next = &local_38;
    local_38.next = &this->queue_;
    do {
      if ((this->queue_).next == &local_38) goto LAB_0011343f;
      cVar4 = std::condition_variable::
              __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        (&this->cv_,lk,tp);
    } while (cVar4 != timeout);
    if ((this->queue_).next != &local_38) {
      ((node *)&(local_38.next)->next)->prev = local_38.prev;
      (local_38.prev)->next = local_38.next;
      return false;
    }
LAB_0011343f:
    pnVar2 = &this->locked_;
    pnVar1 = (this->queue_).next;
    if (pnVar1 == pnVar2) {
      __assert_fail("front != p",
                    "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/fair_mutex.hpp"
                    ,0xc3,"void yamc::fair::detail::timed_mutex_impl::wq_replace_front(node *)");
    }
    pnVar3 = pnVar1->prev;
    pnVar2->next = pnVar1->next;
    (this->locked_).prev = pnVar3;
    pnVar1->next->prev = pnVar2;
    (this->queue_).next = pnVar2;
  }
  return true;
}

Assistant:

bool impl_try_lockwait(std::unique_lock<std::mutex>& lk, const std::chrono::time_point<Clock, Duration>& tp)
  {
    if (!wq_empty()) {
      node request;
      wq_push_back(&request);
      while (queue_.next != &request) {
        if (cv_.wait_until(lk, tp) == std::cv_status::timeout) {
          if (queue_.next == &request)  // re-check predicate
            break;
          wq_erase(&request);
          return false;
        }
      }
      wq_replace_front(&locked_);
    } else {
      wq_push_back(&locked_);
    }
    return true;
  }